

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtesttostring.h
# Opt level: O3

char * QTest::toString<QModelIndex>(QModelIndex *idx)

{
  char *pcVar1;
  long in_FS_OFFSET;
  char msg [128];
  char local_98 [136];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_98[0x70] = -0x56;
  local_98[0x71] = -0x56;
  local_98[0x72] = -0x56;
  local_98[0x73] = -0x56;
  local_98[0x74] = -0x56;
  local_98[0x75] = -0x56;
  local_98[0x76] = -0x56;
  local_98[0x77] = -0x56;
  local_98[0x78] = -0x56;
  local_98[0x79] = -0x56;
  local_98[0x7a] = -0x56;
  local_98[0x7b] = -0x56;
  local_98[0x7c] = -0x56;
  local_98[0x7d] = -0x56;
  local_98[0x7e] = -0x56;
  local_98[0x7f] = -0x56;
  local_98[0x60] = -0x56;
  local_98[0x61] = -0x56;
  local_98[0x62] = -0x56;
  local_98[99] = -0x56;
  local_98[100] = -0x56;
  local_98[0x65] = -0x56;
  local_98[0x66] = -0x56;
  local_98[0x67] = -0x56;
  local_98[0x68] = -0x56;
  local_98[0x69] = -0x56;
  local_98[0x6a] = -0x56;
  local_98[0x6b] = -0x56;
  local_98[0x6c] = -0x56;
  local_98[0x6d] = -0x56;
  local_98[0x6e] = -0x56;
  local_98[0x6f] = -0x56;
  local_98[0x50] = -0x56;
  local_98[0x51] = -0x56;
  local_98[0x52] = -0x56;
  local_98[0x53] = -0x56;
  local_98[0x54] = -0x56;
  local_98[0x55] = -0x56;
  local_98[0x56] = -0x56;
  local_98[0x57] = -0x56;
  local_98[0x58] = -0x56;
  local_98[0x59] = -0x56;
  local_98[0x5a] = -0x56;
  local_98[0x5b] = -0x56;
  local_98[0x5c] = -0x56;
  local_98[0x5d] = -0x56;
  local_98[0x5e] = -0x56;
  local_98[0x5f] = -0x56;
  local_98[0x40] = -0x56;
  local_98[0x41] = -0x56;
  local_98[0x42] = -0x56;
  local_98[0x43] = -0x56;
  local_98[0x44] = -0x56;
  local_98[0x45] = -0x56;
  local_98[0x46] = -0x56;
  local_98[0x47] = -0x56;
  local_98[0x48] = -0x56;
  local_98[0x49] = -0x56;
  local_98[0x4a] = -0x56;
  local_98[0x4b] = -0x56;
  local_98[0x4c] = -0x56;
  local_98[0x4d] = -0x56;
  local_98[0x4e] = -0x56;
  local_98[0x4f] = -0x56;
  local_98[0x30] = -0x56;
  local_98[0x31] = -0x56;
  local_98[0x32] = -0x56;
  local_98[0x33] = -0x56;
  local_98[0x34] = -0x56;
  local_98[0x35] = -0x56;
  local_98[0x36] = -0x56;
  local_98[0x37] = -0x56;
  local_98[0x38] = -0x56;
  local_98[0x39] = -0x56;
  local_98[0x3a] = -0x56;
  local_98[0x3b] = -0x56;
  local_98[0x3c] = -0x56;
  local_98[0x3d] = -0x56;
  local_98[0x3e] = -0x56;
  local_98[0x3f] = -0x56;
  local_98[0x20] = -0x56;
  local_98[0x21] = -0x56;
  local_98[0x22] = -0x56;
  local_98[0x23] = -0x56;
  local_98[0x24] = -0x56;
  local_98[0x25] = -0x56;
  local_98[0x26] = -0x56;
  local_98[0x27] = -0x56;
  local_98[0x28] = -0x56;
  local_98[0x29] = -0x56;
  local_98[0x2a] = -0x56;
  local_98[0x2b] = -0x56;
  local_98[0x2c] = -0x56;
  local_98[0x2d] = -0x56;
  local_98[0x2e] = -0x56;
  local_98[0x2f] = -0x56;
  local_98[0x10] = -0x56;
  local_98[0x11] = -0x56;
  local_98[0x12] = -0x56;
  local_98[0x13] = -0x56;
  local_98[0x14] = -0x56;
  local_98[0x15] = -0x56;
  local_98[0x16] = -0x56;
  local_98[0x17] = -0x56;
  local_98[0x18] = -0x56;
  local_98[0x19] = -0x56;
  local_98[0x1a] = -0x56;
  local_98[0x1b] = -0x56;
  local_98[0x1c] = -0x56;
  local_98[0x1d] = -0x56;
  local_98[0x1e] = -0x56;
  local_98[0x1f] = -0x56;
  local_98[0] = -0x56;
  local_98[1] = -0x56;
  local_98[2] = -0x56;
  local_98[3] = -0x56;
  local_98[4] = -0x56;
  local_98[5] = -0x56;
  local_98[6] = -0x56;
  local_98[7] = -0x56;
  local_98[8] = -0x56;
  local_98[9] = -0x56;
  local_98[10] = -0x56;
  local_98[0xb] = -0x56;
  local_98[0xc] = -0x56;
  local_98[0xd] = -0x56;
  local_98[0xe] = -0x56;
  local_98[0xf] = -0x56;
  snprintf(local_98,0x80,"QModelIndex(%d,%d,%p,%p)",(ulong)(uint)idx->r,(ulong)(uint)idx->c,idx->i,
           (idx->m).ptr);
  pcVar1 = (char *)qstrdup(local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return pcVar1;
  }
  __stack_chk_fail();
}

Assistant:

inline char *toString(const QModelIndex &idx)
{
    char msg[128];
    std::snprintf(msg, sizeof(msg), "QModelIndex(%d,%d,%p,%p)",
                  idx.row(), idx.column(), idx.internalPointer(),
                  static_cast<const void*>(idx.model()));
    return qstrdup(msg);
}